

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

void __thiscall
doctest::anon_unknown_14::JUnitReporter::test_run_end(JUnitReporter *this,TestRunStats *p)

{
  pointer pJVar1;
  pointer pJVar2;
  XmlWriter *this_00;
  char *__s;
  ContextOptions *pCVar3;
  pointer pJVar4;
  String *file;
  allocator<char> local_132;
  allocator<char> local_131;
  XmlWriter *local_130;
  JUnitReporter *local_128;
  allocator<char> local_11b;
  allocator<char> local_11a;
  allocator<char> local_119;
  pointer local_118;
  string local_110;
  tm timeInfo;
  undefined1 local_b8 [32];
  char timeStamp [21];
  time_t rawtime;
  string binary_name;
  
  pCVar3 = this->opt;
  if ((pCVar3->binary_name).field_0.buf[0x17] < '\0') {
    file = (String *)(pCVar3->binary_name).field_0.data.ptr;
  }
  else {
    file = &pCVar3->binary_name;
  }
  local_128 = this;
  __s = skipPathFromFilename((char *)file);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&binary_name,__s,(allocator<char> *)&timeInfo);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&timeInfo,"testsuites",(allocator<char> *)&local_110);
  local_130 = &local_128->xml;
  XmlWriter::startElement(local_130,(string *)&timeInfo);
  std::__cxx11::string::~string((string *)&timeInfo);
  std::__cxx11::string::string<std::allocator<char>>((string *)&timeInfo,"testsuite",&local_132);
  XmlWriter::startElement(local_130,(string *)&timeInfo);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"name",&local_131);
  XmlWriter::writeAttribute(local_130,&local_110,&binary_name);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_b8,"errors",&local_119);
  XmlWriter::writeAttribute<int>
            (local_130,(string *)local_b8,&(local_128->testCaseData).totalErrors);
  std::__cxx11::string::string<std::allocator<char>>((string *)timeStamp,"failures",&local_11a);
  XmlWriter::writeAttribute<int>
            (local_130,(string *)timeStamp,&(local_128->testCaseData).totalFailures);
  std::__cxx11::string::string<std::allocator<char>>((string *)&rawtime,"tests",&local_11b);
  XmlWriter::writeAttribute<int>(local_130,(string *)&rawtime,&p->numAsserts);
  std::__cxx11::string::~string((string *)&rawtime);
  std::__cxx11::string::~string((string *)timeStamp);
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&timeInfo);
  pCVar3 = local_128->opt;
  if (pCVar3->no_time_in_output == false) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&timeInfo,"time",(allocator<char> *)&local_110);
    XmlWriter::writeAttribute<double>
              (local_130,(string *)&timeInfo,&(local_128->testCaseData).totalSeconds);
    std::__cxx11::string::~string((string *)&timeInfo);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"timestamp",&local_131);
    time(&rawtime);
    gmtime_r(&rawtime,(tm *)&timeInfo);
    strftime(timeStamp,0x15,"%Y-%m-%dT%H:%M:%SZ",(tm *)&timeInfo);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_b8,timeStamp,&local_132);
    XmlWriter::writeAttribute(local_130,&local_110,(string *)local_b8);
    std::__cxx11::string::~string((string *)local_b8);
    std::__cxx11::string::~string((string *)&local_110);
    pCVar3 = local_128->opt;
  }
  if (pCVar3->no_version == false) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&timeInfo,"doctest_version",(allocator<char> *)&local_110);
    XmlWriter::writeAttribute(local_130,(string *)&timeInfo,"2.4.6");
    std::__cxx11::string::~string((string *)&timeInfo);
  }
  pJVar1 = (local_128->testCaseData).testcases.
           super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (local_118 = (local_128->testCaseData).testcases.
                   super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase>_>
                   ._M_impl.super__Vector_impl_data._M_start; this_00 = local_130,
      local_118 != pJVar1; local_118 = local_118 + 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&timeInfo,"testcase",(allocator<char> *)timeStamp);
    XmlWriter::startElement(local_130,(string *)&timeInfo);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_110,"classname",(allocator<char> *)&rawtime);
    XmlWriter::writeAttribute(local_130,&local_110,&local_118->classname);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_b8,"name",&local_132);
    XmlWriter::writeAttribute(local_130,(string *)local_b8,&local_118->name);
    std::__cxx11::string::~string((string *)local_b8);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&timeInfo);
    if (local_128->opt->no_time_in_output == false) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&timeInfo,"time",(allocator<char> *)&local_110);
      XmlWriter::writeAttribute<double>(local_130,(string *)&timeInfo,&local_118->time);
      std::__cxx11::string::~string((string *)&timeInfo);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&timeInfo,"status",(allocator<char> *)&local_110);
    XmlWriter::writeAttribute(local_130,(string *)&timeInfo,"run");
    std::__cxx11::string::~string((string *)&timeInfo);
    pJVar2 = (local_118->failures).
             super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pJVar4 = (local_118->failures).
                  super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
                  ._M_impl.super__Vector_impl_data._M_start; pJVar4 != pJVar2; pJVar4 = pJVar4 + 1)
    {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&timeInfo,"failure",(allocator<char> *)&rawtime);
      XmlWriter::scopedElement((XmlWriter *)timeStamp,(string *)local_130);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"message",&local_132);
      XmlWriter::writeAttribute((XmlWriter *)timeStamp._0_8_,&local_110,&pJVar4->message);
      std::__cxx11::string::string<std::allocator<char>>((string *)local_b8,"type",&local_131);
      XmlWriter::writeAttribute((XmlWriter *)timeStamp._0_8_,(string *)local_b8,&pJVar4->type);
      XmlWriter::ScopedElement::writeText((ScopedElement *)timeStamp,&pJVar4->details,false);
      std::__cxx11::string::~string((string *)local_b8);
      std::__cxx11::string::~string((string *)&local_110);
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)timeStamp);
      std::__cxx11::string::~string((string *)&timeInfo);
    }
    pJVar2 = (local_118->errors).
             super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pJVar4 = (local_118->errors).
                  super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
                  ._M_impl.super__Vector_impl_data._M_start; pJVar4 != pJVar2; pJVar4 = pJVar4 + 1)
    {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&timeInfo,"error",(allocator<char> *)timeStamp);
      XmlWriter::scopedElement((XmlWriter *)local_b8,(string *)local_130);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_110,"message",(allocator<char> *)&rawtime);
      XmlWriter::writeAttribute((XmlWriter *)local_b8._0_8_,&local_110,&pJVar4->message);
      XmlWriter::ScopedElement::writeText((ScopedElement *)local_b8,&pJVar4->details,true);
      std::__cxx11::string::~string((string *)&local_110);
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_b8);
      std::__cxx11::string::~string((string *)&timeInfo);
    }
    XmlWriter::endElement(local_130);
  }
  XmlWriter::endElement(local_130);
  XmlWriter::endElement(this_00);
  std::__cxx11::string::~string((string *)&binary_name);
  return;
}

Assistant:

void test_run_end(const TestRunStats& p) override {
            // remove .exe extension - mainly to have the same output on UNIX and Windows
            std::string binary_name = skipPathFromFilename(opt.binary_name.c_str());
#ifdef DOCTEST_PLATFORM_WINDOWS
            if(binary_name.rfind(".exe") != std::string::npos)
                binary_name = binary_name.substr(0, binary_name.length() - 4);
#endif // DOCTEST_PLATFORM_WINDOWS
            xml.startElement("testsuites");
            xml.startElement("testsuite").writeAttribute("name", binary_name)
                    .writeAttribute("errors", testCaseData.totalErrors)
                    .writeAttribute("failures", testCaseData.totalFailures)
                    .writeAttribute("tests", p.numAsserts);
            if(opt.no_time_in_output == false) {
                xml.writeAttribute("time", testCaseData.totalSeconds);
                xml.writeAttribute("timestamp", JUnitTestCaseData::getCurrentTimestamp());
            }
            if(opt.no_version == false)
                xml.writeAttribute("doctest_version", DOCTEST_VERSION_STR);

            for(const auto& testCase : testCaseData.testcases) {
                xml.startElement("testcase")
                    .writeAttribute("classname", testCase.classname)
                    .writeAttribute("name", testCase.name);
                if(opt.no_time_in_output == false)
                    xml.writeAttribute("time", testCase.time);
                // This is not ideal, but it should be enough to mimic gtest's junit output.
                xml.writeAttribute("status", "run");

                for(const auto& failure : testCase.failures) {
                    xml.scopedElement("failure")
                        .writeAttribute("message", failure.message)
                        .writeAttribute("type", failure.type)
                        .writeText(failure.details, false);
                }

                for(const auto& error : testCase.errors) {
                    xml.scopedElement("error")
                        .writeAttribute("message", error.message)
                        .writeText(error.details);
                }

                xml.endElement();
            }
            xml.endElement();
            xml.endElement();
        }